

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall tf::Node::_release_all(Node *this,SmallVector<tf::Node_*,_2U> *nodes)

{
  pointer pSVar1;
  iterator ppSVar2;
  Semaphore **sem;
  iterator __end1;
  iterator __begin1;
  SmallVector<tf::Semaphore_*,_2U> *__range1;
  SmallVector<tf::Semaphore_*,_2U> *to_release;
  iterator local_28;
  
  pSVar1 = std::unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>::
           operator->((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                       *)0x1102bf);
  local_28 = SmallVectorTemplateCommon<tf::Semaphore_*,_void>::begin
                       ((SmallVectorTemplateCommon<tf::Semaphore_*,_void> *)&pSVar1->to_release);
  ppSVar2 = SmallVectorTemplateCommon<tf::Semaphore_*,_void>::end
                      ((SmallVectorTemplateCommon<tf::Semaphore_*,_void> *)&pSVar1->to_release);
  for (; local_28 != ppSVar2; local_28 = local_28 + 1) {
    Semaphore::_release((Semaphore *)to_release,(SmallVector<tf::Node_*,_2U> *)__range1);
  }
  return;
}

Assistant:

inline void Node::_release_all(SmallVector<Node*>& nodes) {
  // assert(_semaphores != nullptr);
  auto& to_release = _semaphores->to_release;
  for(const auto& sem : to_release) {
    sem->_release(nodes);
  }
}